

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerShapeConstraints.cpp
# Opt level: O1

RangeValue __thiscall CoreML::RangeValue::operator-(RangeValue *this,RangeValue *other)

{
  undefined7 extraout_var;
  size_t sVar1;
  size_t extraout_RAX;
  size_t sVar2;
  undefined7 uVar3;
  runtime_error *this_00;
  RangeValue RVar4;
  stringstream ss;
  RangeValue local_1d8;
  string local_1c8 [32];
  RangeValue local_1a8;
  ostream local_198 [376];
  
  if (other->_isUnbound == true) {
    if (this->_isUnbound == false) {
      std::__cxx11::stringstream::stringstream((stringstream *)&local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_198,"Subtracting unbound range ",0x1a);
      ::operator<<(local_198,other);
      std::__ostream_insert<char,std::char_traits<char>>(local_198," from bound range ",0x12);
      ::operator<<(local_198,this);
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(this_00,local_1c8);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    RangeValue(&local_1d8);
    uVar3 = extraout_var;
  }
  else {
    sVar1 = value(other);
    RangeValue(&local_1a8);
    sVar2 = extraout_RAX;
    if (this->_isUnbound == false) {
      sVar2 = this->_val - sVar1;
      local_1a8._val = sVar2;
      if (this->_val < sVar1) {
        local_1a8._val = 0;
      }
      local_1a8._isUnbound = false;
    }
    uVar3 = (undefined7)(sVar2 >> 8);
    local_1d8._isUnbound = local_1a8._isUnbound;
    local_1d8._val = local_1a8._val;
  }
  RVar4._1_7_ = uVar3;
  RVar4._isUnbound = local_1d8._isUnbound;
  RVar4._val = local_1d8._val;
  return RVar4;
}

Assistant:

RangeValue RangeValue::operator- (const RangeValue& other) const {
    if (other.isUnbound() && !(this->isUnbound())) {
        std::stringstream ss;
        ss << "Subtracting unbound range " << other << " from bound range " << *this;
        throw std::runtime_error(ss.str());
    }
    else if (other.isUnbound()) {
        // both unbound
        return RangeValue();
    }
    else {
        return (*this)-other.value();
    }
}